

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O1

optional<pbrt::SquareMatrix<3>_> *
pbrt::LinearLeastSquares<3>
          (optional<pbrt::SquareMatrix<3>_> *__return_storage_ptr__,Float (*A) [3],Float (*B) [3],
          int rows)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  Float (*paFVar4) [3];
  undefined1 (*pauVar5) [64];
  undefined1 (*pauVar6) [16];
  long lVar7;
  uint *puVar8;
  int j_1;
  Float *pFVar9;
  long lVar10;
  uint *puVar11;
  int k;
  Float *pFVar12;
  long lVar13;
  Float *pFVar14;
  undefined1 *puVar15;
  int j;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  SquareMatrix<3> AtB;
  SquareMatrix<3> AtA;
  SquareMatrix<3> r_1;
  SquareMatrix<3> r;
  optional<pbrt::SquareMatrix<3>_> AtAi;
  undefined1 local_e8 [32];
  undefined4 local_c8;
  SquareMatrix<3> local_b8;
  undefined1 auStack_90 [36];
  undefined4 local_6c [9];
  undefined1 auStack_48 [36];
  char local_24;
  
  pauVar5 = (undefined1 (*) [64])local_e8;
  paFVar4 = (Float (*) [3])&local_b8;
  lVar7 = 0;
  auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar21 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
  do {
    auVar22 = vpbroadcastq_avx512f();
    uVar1 = vpcmpeqq_avx512f(auVar22,auVar20);
    uVar2 = vpcmpeqq_avx512f(auVar22,auVar21);
    auVar22 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar2,(char)uVar1));
    auVar22 = vpsrld_avx512f(auVar22,0x1f);
    auVar22 = vcvtdq2ps_avx512f(auVar22);
    auVar22._12_4_ = paFVar4[1][0];
    auVar22._16_4_ = paFVar4[1][1];
    auVar22._20_4_ = paFVar4[1][2];
    auVar22._24_4_ = paFVar4[2][0];
    auVar22._28_4_ = paFVar4[2][1];
    auVar22._32_4_ = paFVar4[2][2];
    auVar22._36_4_ = ((SquareMatrix<3> *)(paFVar4 + 3))->m[0][0];
    auVar22._40_4_ = ((SquareMatrix<3> *)(paFVar4 + 3))->m[0][1];
    auVar22._44_4_ = ((SquareMatrix<3> *)(paFVar4 + 3))->m[0][2];
    auVar22._48_4_ = paFVar4[4][0];
    auVar22._52_4_ = paFVar4[4][1];
    auVar22._56_4_ = paFVar4[4][2];
    auVar22._60_4_ = paFVar4[5][0];
    *(undefined1 (*) [64])paFVar4 = auVar22;
    lVar7 = lVar7 + 1;
    paFVar4 = paFVar4 + 1;
  } while (lVar7 != 3);
  auVar18 = ZEXT1232(ZEXT812(0));
  local_b8.m[0][0] = (Float)auVar18._0_4_;
  local_b8.m[0][1] = (Float)auVar18._4_4_;
  local_b8.m[0][2] = (Float)auVar18._8_4_;
  local_b8.m[1][0] = (Float)auVar18._12_4_;
  local_b8.m[1][1] = (Float)auVar18._16_4_;
  local_b8.m[1][2] = (Float)auVar18._20_4_;
  local_b8.m[2][0] = (Float)auVar18._24_4_;
  local_b8.m[2][1] = (Float)auVar18._28_4_;
  local_b8.m[2][2] = 0.0;
  lVar7 = 0;
  do {
    auVar22 = vpbroadcastq_avx512f();
    uVar1 = vpcmpeqq_avx512f(auVar22,auVar20);
    uVar2 = vpcmpeqq_avx512f(auVar22,auVar21);
    auVar22 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar2,(char)uVar1));
    auVar22 = vpsrld_avx512f(auVar22,0x1f);
    auVar22 = vcvtdq2ps_avx512f(auVar22);
    auVar24._0_12_ = auVar22._0_12_;
    auVar24._12_4_ = *(undefined4 *)(*pauVar5 + 0xc);
    auVar24._16_4_ = *(undefined4 *)(*pauVar5 + 0x10);
    auVar24._20_4_ = *(undefined4 *)(*pauVar5 + 0x14);
    auVar24._24_4_ = *(undefined4 *)(*pauVar5 + 0x18);
    auVar24._28_4_ = *(undefined4 *)(*pauVar5 + 0x1c);
    auVar24._32_4_ = *(undefined4 *)(*pauVar5 + 0x20);
    auVar24._36_4_ = *(undefined4 *)(*pauVar5 + 0x24);
    auVar24._40_4_ = *(undefined4 *)(*pauVar5 + 0x28);
    auVar24._44_4_ = *(undefined4 *)(*pauVar5 + 0x2c);
    auVar24._48_4_ = *(undefined4 *)(*pauVar5 + 0x30);
    auVar24._52_4_ = *(undefined4 *)(*pauVar5 + 0x34);
    auVar24._56_4_ = *(undefined4 *)(*pauVar5 + 0x38);
    auVar24._60_4_ = *(undefined4 *)(*pauVar5 + 0x3c);
    *pauVar5 = auVar24;
    lVar7 = lVar7 + 1;
    pauVar5 = (undefined1 (*) [64])(*pauVar5 + 0xc);
  } while (lVar7 != 3);
  local_e8 = ZEXT1232(ZEXT812(0));
  local_c8 = 0;
  lVar7 = 0;
  pFVar9 = *A;
  do {
    lVar10 = lVar7 * 0xc + -0xe8;
    lVar16 = 0;
    pFVar12 = *B;
    pFVar14 = *A;
    do {
      if (0 < rows) {
        auVar21 = ZEXT464((uint)local_b8.m[lVar7][lVar16]);
        auVar20 = ZEXT464(*(uint *)(local_e8 + lVar16 * 4 + lVar10 + 0xe8));
        lVar13 = 0;
        do {
          auVar17 = vfmadd231ss_fma(auVar21._0_16_,ZEXT416(*(uint *)((long)pFVar9 + lVar13)),
                                    ZEXT416(*(uint *)((long)pFVar14 + lVar13)));
          auVar21 = ZEXT1664(auVar17);
          auVar3 = vfmadd231ss_fma(auVar20._0_16_,ZEXT416(*(uint *)((long)pFVar9 + lVar13)),
                                   ZEXT416(*(uint *)((long)pFVar12 + lVar13)));
          auVar20 = ZEXT1664(auVar3);
          lVar13 = lVar13 + 0xc;
        } while ((ulong)(uint)rows * 0xc != lVar13);
        local_b8.m[lVar7][lVar16] = auVar17._0_4_;
        *(int *)(local_e8 + lVar16 * 4 + lVar10 + 0xe8) = auVar3._0_4_;
      }
      lVar16 = lVar16 + 1;
      pFVar14 = pFVar14 + 1;
      pFVar12 = pFVar12 + 1;
    } while (lVar16 != 3);
    lVar7 = lVar7 + 1;
    pFVar9 = pFVar9 + 1;
  } while (lVar7 != 3);
  puVar15 = auStack_48;
  Inverse<3>(&local_b8);
  if (local_24 == '\0') {
    *(undefined8 *)&__return_storage_ptr__->optionalValue = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  }
  else {
    pauVar5 = (undefined1 (*) [64])local_6c;
    lVar7 = 0;
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    do {
      auVar22 = vpbroadcastq_avx512f();
      uVar1 = vpcmpeqq_avx512f(auVar22,auVar20);
      uVar2 = vpcmpeqq_avx512f(auVar22,auVar21);
      auVar22 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar2,(char)uVar1));
      auVar22 = vpsrld_avx512f(auVar22,0x1f);
      auVar22 = vcvtdq2ps_avx512f(auVar22);
      auVar23._0_12_ = auVar22._0_12_;
      auVar23._12_4_ = *(undefined4 *)((long)*pauVar5 + 0xc);
      auVar23._16_4_ = *(undefined4 *)((long)*pauVar5 + 0x10);
      auVar23._20_4_ = *(undefined4 *)((long)*pauVar5 + 0x14);
      auVar23._24_4_ = *(undefined4 *)((long)*pauVar5 + 0x18);
      auVar23._28_4_ = *(undefined4 *)((long)*pauVar5 + 0x1c);
      auVar23._32_4_ = *(undefined4 *)((long)*pauVar5 + 0x20);
      auVar23._36_4_ = *(undefined4 *)((long)*pauVar5 + 0x24);
      auVar23._40_4_ = *(undefined4 *)((long)*pauVar5 + 0x28);
      auVar23._44_4_ = *(undefined4 *)((long)*pauVar5 + 0x2c);
      auVar23._48_4_ = *(undefined4 *)((long)*pauVar5 + 0x30);
      auVar23._52_4_ = *(undefined4 *)((long)*pauVar5 + 0x34);
      auVar23._56_4_ = *(undefined4 *)((long)*pauVar5 + 0x38);
      auVar23._60_4_ = *(undefined4 *)((long)*pauVar5 + 0x3c);
      *pauVar5 = auVar23;
      lVar7 = lVar7 + 1;
      pauVar5 = (undefined1 (*) [64])((long)*pauVar5 + 0xc);
    } while (lVar7 != 3);
    lVar7 = 0;
    do {
      lVar10 = 0;
      puVar8 = (uint *)local_e8;
      do {
        local_6c[lVar7 * 3 + lVar10] = 0;
        auVar17 = ZEXT816(0) << 0x40;
        lVar16 = 0;
        puVar11 = puVar8;
        do {
          auVar17 = vfmadd231ss_fma(auVar17,ZEXT416(*(uint *)(puVar15 + lVar16 * 4)),
                                    ZEXT416(*puVar11));
          lVar16 = lVar16 + 1;
          puVar11 = puVar11 + 3;
        } while (lVar16 != 3);
        local_6c[lVar7 * 3 + lVar10] = auVar17._0_4_;
        lVar10 = lVar10 + 1;
        puVar8 = puVar8 + 1;
      } while (lVar10 != 3);
      lVar7 = lVar7 + 1;
      puVar15 = puVar15 + 0xc;
    } while (lVar7 != 3);
    pauVar5 = (undefined1 (*) [64])auStack_90;
    lVar7 = 0;
    do {
      auVar22 = vpbroadcastq_avx512f();
      uVar1 = vpcmpeqq_avx512f(auVar22,auVar20);
      uVar2 = vpcmpeqq_avx512f(auVar22,auVar21);
      auVar22 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar2,(char)uVar1));
      auVar22 = vpsrld_avx512f(auVar22,0x1f);
      auVar24 = vcvtdq2ps_avx512f(auVar22);
      auVar22 = *pauVar5;
      auVar25._0_12_ = auVar24._0_12_;
      auVar25._12_4_ = auVar22._12_4_;
      auVar25._16_4_ = auVar22._16_4_;
      auVar25._20_4_ = auVar22._20_4_;
      auVar25._24_4_ = auVar22._24_4_;
      auVar25._28_4_ = auVar22._28_4_;
      auVar25._32_4_ = auVar22._32_4_;
      auVar25._36_4_ = auVar22._36_4_;
      auVar25._40_4_ = auVar22._40_4_;
      auVar25._44_4_ = auVar22._44_4_;
      auVar25._48_4_ = auVar22._48_4_;
      auVar25._52_4_ = auVar22._52_4_;
      auVar25._56_4_ = auVar22._56_4_;
      auVar25._60_4_ = auVar22._60_4_;
      *pauVar5 = auVar25;
      lVar7 = lVar7 + 1;
      pauVar5 = (undefined1 (*) [64])(*pauVar5 + 0xc);
    } while (lVar7 != 3);
    auVar18 = vpbroadcastq_avx512vl();
    auVar18 = vpaddq_avx2(auVar18,_DAT_0056e4e0);
    pauVar6 = (undefined1 (*) [16])auStack_90;
    lVar7 = 0;
    do {
      auVar19 = vpbroadcastq_avx512vl();
      auVar19 = vpsllq_avx2(auVar19,2);
      vpaddq_avx2(auVar18,auVar19);
      auVar17 = vgatherqps_avx512vl(*(undefined8 *)*pauVar6);
      auVar17._12_4_ = SUB164(*pauVar6,0xc);
      *pauVar6 = auVar17;
      lVar7 = lVar7 + 1;
      pauVar6 = (undefined1 (*) [16])(*pauVar6 + 0xc);
    } while (lVar7 != 3);
    __return_storage_ptr__->set = true;
    *(undefined8 *)&__return_storage_ptr__->optionalValue = auStack_90._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = auStack_90._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = auStack_90._16_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = auStack_90._24_8_;
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = auStack_90._32_4_;
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<SquareMatrix<N>> LinearLeastSquares(const Float A[][N], const Float B[][N],
                                                   int rows) {
    SquareMatrix<N> AtA = SquareMatrix<N>::Zero();
    SquareMatrix<N> AtB = SquareMatrix<N>::Zero();

    for (int i = 0; i < N; ++i)
        for (int j = 0; j < N; ++j)
            for (int r = 0; r < rows; ++r) {
                AtA[i][j] += A[r][i] * A[r][j];
                AtB[i][j] += A[r][i] * B[r][j];
            }

    auto AtAi = Inverse(AtA);
    if (!AtAi)
        return {};
    return Transpose(*AtAi * AtB);
}